

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_isb_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode)

{
  Family family;
  anon_class_8_1_8991fb9c local_d0;
  StepT local_c8;
  Pipeline local_98;
  undefined1 local_3d;
  MemoryAccess local_3c;
  Mos6502 *pMStack_38;
  MemoryAccess memory_access;
  Mos6502 *this_local;
  AddressMode local_28;
  Mos6502 *local_20;
  Opcode opcode_local;
  Pipeline *result;
  
  local_28 = opcode.address_mode;
  this_local = opcode._0_8_;
  local_20._0_4_ = opcode.family;
  family = (Family)local_20;
  pMStack_38 = this;
  local_20 = this_local;
  opcode_local.family = local_28;
  unique0x100000fa = __return_storage_ptr__;
  local_3c = get_memory_access(family);
  local_3d = 0;
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps(&local_98,this,opcode_local.family,local_3c);
  Pipeline::append(__return_storage_ptr__,&local_98);
  Pipeline::~Pipeline(&local_98);
  local_d0.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_isb_instruction(n_e_s::core::Opcode)::__0,void>
            ((function<void()> *)&local_c8,&local_d0);
  Pipeline::push(__return_storage_ptr__,&local_c8);
  std::function<void_()>::~function(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_isb_instruction(Opcode opcode) {
    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));

    // ISB = INC + SBC
    result.push([this] {
        const uint8_t new_value = tmp_ + static_cast<uint8_t>(1);
        set_zero(new_value);
        set_negative(new_value);
        mmu_->write_byte(effective_address_, new_value);

        // SBC simply takes the ones complement of the second value and then
        // performs an ADC See:
        // http://www.righto.com/2012/12/the-6502-overflow-flag-explained.html
        const uint8_t addend = new_value;
        adc_impl(~addend);
    });

    return result;
}